

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  size_t i;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  byte bVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  bool bVar30;
  byte bVar31;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 in_ZMM16 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_23d8 [16];
  undefined1 local_23c8 [16];
  undefined1 local_23b8 [16];
  undefined1 local_23a8 [16];
  undefined1 local_2398 [16];
  undefined1 local_2388 [16];
  size_t local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  puVar17 = local_2368;
  local_2378 = root.ptr;
  local_2370[0] = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar59._4_4_ = fVar1;
  auVar59._0_4_ = fVar1;
  auVar59._8_4_ = fVar1;
  auVar59._12_4_ = fVar1;
  auVar59._16_4_ = fVar1;
  auVar59._20_4_ = fVar1;
  auVar59._24_4_ = fVar1;
  auVar59._28_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar60._4_4_ = fVar2;
  auVar60._0_4_ = fVar2;
  auVar60._8_4_ = fVar2;
  auVar60._12_4_ = fVar2;
  auVar60._16_4_ = fVar2;
  auVar60._20_4_ = fVar2;
  auVar60._24_4_ = fVar2;
  auVar60._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar61._4_4_ = fVar3;
  auVar61._0_4_ = fVar3;
  auVar61._8_4_ = fVar3;
  auVar61._12_4_ = fVar3;
  auVar61._16_4_ = fVar3;
  auVar61._20_4_ = fVar3;
  auVar61._24_4_ = fVar3;
  auVar61._28_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar48 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar69 = ZEXT3264(auVar48);
  auVar62._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar62._8_4_ = -fVar1;
  auVar62._12_4_ = -fVar1;
  auVar62._16_4_ = -fVar1;
  auVar62._20_4_ = -fVar1;
  auVar62._24_4_ = -fVar1;
  auVar62._28_4_ = -fVar1;
  auVar63._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar63._8_4_ = -fVar2;
  auVar63._12_4_ = -fVar2;
  auVar63._16_4_ = -fVar2;
  auVar63._20_4_ = -fVar2;
  auVar63._24_4_ = -fVar2;
  auVar63._28_4_ = -fVar2;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar64._4_4_ = iVar4;
  auVar64._0_4_ = iVar4;
  auVar64._8_4_ = iVar4;
  auVar64._12_4_ = iVar4;
  auVar64._16_4_ = iVar4;
  auVar64._20_4_ = iVar4;
  auVar64._24_4_ = iVar4;
  auVar64._28_4_ = iVar4;
  auVar65._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar65._8_4_ = -fVar3;
  auVar65._12_4_ = -fVar3;
  auVar65._16_4_ = -fVar3;
  auVar65._20_4_ = -fVar3;
  auVar65._24_4_ = -fVar3;
  auVar65._28_4_ = -fVar3;
  auVar48 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar66._8_4_ = 0xfffffff8;
  auVar66._0_8_ = 0xfffffff8fffffff8;
  auVar66._12_4_ = 0xfffffff8;
  auVar66._16_4_ = 0xfffffff8;
  auVar66._20_4_ = 0xfffffff8;
  auVar66._24_4_ = 0xfffffff8;
  auVar66._28_4_ = 0xfffffff8;
  auVar67._8_4_ = 0x80000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar67._12_4_ = 0x80000000;
  auVar68._8_4_ = 0x7fffffff;
  auVar68._0_8_ = 0x7fffffff7fffffff;
  auVar68._12_4_ = 0x7fffffff;
  auVar32 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
LAB_01d8f7b8:
  do {
    if (puVar17 == &local_2378) {
      return;
    }
    bVar30 = puVar17 < &DAT_00000010;
    puVar17 = puVar17 + -2;
    vucomiss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  } while (bVar30 && puVar17 != (ulong *)0x0);
  uVar18 = *puVar17;
LAB_01d8f7d9:
  do {
    if ((uVar18 & 8) != 0) break;
    auVar49 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar20),auVar62,auVar59);
    auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar21),auVar63,auVar60);
    auVar49 = vpmaxsd_avx512vl(auVar49,auVar50);
    auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar22),auVar65,auVar61);
    auVar50 = vpmaxsd_avx512vl(auVar50,auVar64);
    auVar49 = vpmaxsd_avx512vl(auVar49,auVar50);
    auVar50 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar20 ^ 0x20)),auVar62,auVar59);
    auVar51 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar21 ^ 0x20)),auVar63,auVar60);
    auVar50 = vpminsd_avx512vl(auVar50,auVar51);
    auVar51 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar22 ^ 0x20)),auVar65,auVar61);
    auVar51 = vpminsd_avx512vl(auVar51,auVar69._0_32_);
    auVar50 = vpminsd_avx512vl(auVar50,auVar51);
    uVar19 = vpcmpd_avx512vl(auVar49,auVar50,2);
    bVar25 = (byte)uVar19;
    if (bVar25 == 0) goto LAB_01d8f7b8;
    auVar50 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(uVar18 & 0xfffffffffffffff0));
    auVar51 = vmovdqu64_avx512vl(((undefined1 (*) [32])(uVar18 & 0xfffffffffffffff0))[1]);
    auVar52 = vmovdqa64_avx512vl(auVar48);
    auVar52 = vpternlogd_avx512vl(auVar52,auVar49,auVar66,0xf8);
    auVar53 = vpcompressd_avx512vl(auVar52);
    auVar57._0_4_ = (uint)(bVar25 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar25 & 1) * auVar52._0_4_;
    bVar30 = (bool)((byte)(uVar19 >> 1) & 1);
    auVar57._4_4_ = (uint)bVar30 * auVar53._4_4_ | (uint)!bVar30 * auVar52._4_4_;
    bVar30 = (bool)((byte)(uVar19 >> 2) & 1);
    auVar57._8_4_ = (uint)bVar30 * auVar53._8_4_ | (uint)!bVar30 * auVar52._8_4_;
    bVar30 = (bool)((byte)(uVar19 >> 3) & 1);
    auVar57._12_4_ = (uint)bVar30 * auVar53._12_4_ | (uint)!bVar30 * auVar52._12_4_;
    bVar30 = (bool)((byte)(uVar19 >> 4) & 1);
    auVar57._16_4_ = (uint)bVar30 * auVar53._16_4_ | (uint)!bVar30 * auVar52._16_4_;
    bVar30 = (bool)((byte)(uVar19 >> 5) & 1);
    auVar57._20_4_ = (uint)bVar30 * auVar53._20_4_ | (uint)!bVar30 * auVar52._20_4_;
    bVar30 = (bool)((byte)(uVar19 >> 6) & 1);
    auVar57._24_4_ = (uint)bVar30 * auVar53._24_4_ | (uint)!bVar30 * auVar52._24_4_;
    bVar30 = SUB81(uVar19 >> 7,0);
    auVar57._28_4_ = (uint)bVar30 * auVar53._28_4_ | (uint)!bVar30 * auVar52._28_4_;
    auVar52 = vmovdqa64_avx512vl(auVar50);
    auVar52 = vpermt2q_avx512vl(auVar52,auVar57,auVar51);
    uVar18 = auVar52._0_8_;
    bVar25 = bVar25 - 1 & bVar25;
    if (bVar25 != 0) {
      auVar52 = vpshufd_avx512vl(auVar57,0x55);
      auVar53 = vmovdqa64_avx512vl(auVar50);
      vpermt2q_avx512vl(auVar53,auVar52,auVar51);
      auVar53 = vpminsd_avx512vl(auVar57,auVar52);
      auVar52 = vpmaxsd_avx512vl(auVar57,auVar52);
      bVar25 = bVar25 - 1 & bVar25;
      if (bVar25 == 0) {
        auVar53 = vpermi2q_avx512vl(auVar53,auVar50,auVar51);
        uVar18 = auVar53._0_8_;
        auVar50 = vpermt2q_avx512vl(auVar50,auVar52,auVar51);
        *puVar17 = auVar50._0_8_;
        lVar29 = 8;
        lVar26 = 0x10;
      }
      else {
        auVar54 = vpshufd_avx512vl(auVar57,0xaa);
        auVar55 = vmovdqa64_avx512vl(auVar50);
        vpermt2q_avx512vl(auVar55,auVar54,auVar51);
        auVar55 = vpminsd_avx512vl(auVar53,auVar54);
        auVar53 = vpmaxsd_avx512vl(auVar53,auVar54);
        auVar54 = vpminsd_avx512vl(auVar52,auVar53);
        auVar53 = vpmaxsd_avx512vl(auVar52,auVar53);
        bVar25 = bVar25 - 1 & bVar25;
        if (bVar25 == 0) {
          auVar52 = vpermi2q_avx512vl(auVar55,auVar50,auVar51);
          uVar18 = auVar52._0_8_;
          auVar52 = vmovdqa64_avx512vl(auVar50);
          auVar52 = vpermt2q_avx512vl(auVar52,auVar53,auVar51);
          *puVar17 = auVar52._0_8_;
          auVar52 = vpermd_avx512vl(auVar53,auVar49);
          *(int *)(puVar17 + 1) = auVar52._0_4_;
          auVar50 = vpermt2q_avx512vl(auVar50,auVar54,auVar51);
          puVar17[2] = auVar50._0_8_;
          auVar52 = vmovdqa64_avx512vl(auVar54);
          lVar29 = 0x18;
          lVar26 = 0x20;
        }
        else {
          auVar52 = vpshufd_avx512vl(auVar57,0xff);
          auVar56 = vmovdqa64_avx512vl(auVar50);
          vpermt2q_avx512vl(auVar56,auVar52,auVar51);
          auVar56 = vpminsd_avx512vl(auVar55,auVar52);
          auVar55 = vpmaxsd_avx512vl(auVar55,auVar52);
          auVar52 = vpminsd_avx512vl(auVar54,auVar55);
          auVar54 = vpmaxsd_avx512vl(auVar54,auVar55);
          auVar55 = vpminsd_avx512vl(auVar53,auVar54);
          auVar53 = vpmaxsd_avx512vl(auVar53,auVar54);
          bVar25 = bVar25 - 1 & bVar25;
          if (bVar25 != 0) {
            auVar58 = valignd_avx512vl(auVar57,auVar57,3);
            auVar57 = vpmovsxbd_avx2(ZEXT816(0x303020108));
            auVar54 = vpermt2d_avx512vl(ZEXT1632(auVar67),auVar57,auVar56);
            auVar57 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar52 = vpermt2d_avx512vl(auVar54,auVar57,auVar52);
            auVar57 = vpermt2d_avx512vl(auVar52,auVar57,auVar55);
            auVar52 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar52 = vpermt2d_avx512vl(auVar57,auVar52,auVar53);
            auVar70 = ZEXT3264(auVar52);
            bVar31 = bVar25;
            do {
              auVar52 = vmovdqa64_avx512vl(auVar70._0_32_);
              auVar53._8_4_ = 1;
              auVar53._0_8_ = 0x100000001;
              auVar53._12_4_ = 1;
              auVar53._16_4_ = 1;
              auVar53._20_4_ = 1;
              auVar53._24_4_ = 1;
              auVar53._28_4_ = 1;
              auVar53 = vpermd_avx512vl(auVar53,auVar58);
              auVar58 = valignd_avx512vl(auVar58,auVar58,1);
              auVar57 = vmovdqa64_avx512vl(auVar50);
              vpermt2q_avx512vl(auVar57,auVar58,auVar51);
              bVar31 = bVar31 - 1 & bVar31;
              uVar16 = vpcmpd_avx512vl(auVar53,auVar52,5);
              auVar53 = vpmaxsd_avx512vl(auVar53,auVar52);
              bVar23 = (byte)uVar16 << 1;
              auVar52 = valignd_avx512vl(auVar52,auVar52,7);
              bVar30 = (bool)((byte)uVar16 & 1);
              bVar8 = (bool)(bVar23 >> 2 & 1);
              bVar9 = (bool)(bVar23 >> 3 & 1);
              bVar10 = (bool)(bVar23 >> 4 & 1);
              bVar11 = (bool)(bVar23 >> 5 & 1);
              bVar12 = (bool)(bVar23 >> 6 & 1);
              auVar70 = ZEXT3264(CONCAT428((uint)(bVar23 >> 7) * auVar52._28_4_ |
                                           (uint)!(bool)(bVar23 >> 7) * auVar53._28_4_,
                                           CONCAT424((uint)bVar12 * auVar52._24_4_ |
                                                     (uint)!bVar12 * auVar53._24_4_,
                                                     CONCAT420((uint)bVar11 * auVar52._20_4_ |
                                                               (uint)!bVar11 * auVar53._20_4_,
                                                               CONCAT416((uint)bVar10 *
                                                                         auVar52._16_4_ |
                                                                         (uint)!bVar10 *
                                                                         auVar53._16_4_,
                                                                         CONCAT412((uint)bVar9 *
                                                                                   auVar52._12_4_ |
                                                                                   (uint)!bVar9 *
                                                                                   auVar53._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar8 * auVar52._8_4_ |
                                                  (uint)!bVar8 * auVar53._8_4_,
                                                  CONCAT44((uint)bVar30 * auVar52._4_4_ |
                                                           (uint)!bVar30 * auVar53._4_4_,
                                                           auVar53._0_4_))))))));
            } while (bVar31 != 0);
            lVar26 = (ulong)(uint)POPCOUNT((uint)bVar25) + 3;
            while( true ) {
              auVar52 = vmovdqa64_avx512vl(auVar50);
              auVar53 = auVar70._0_32_;
              auVar52 = vpermt2q_avx512vl(auVar52,auVar53,auVar51);
              uVar18 = auVar52._0_8_;
              bVar30 = lVar26 == 0;
              lVar26 = lVar26 + -1;
              if (bVar30) break;
              *puVar17 = uVar18;
              auVar52 = vpermd_avx512vl(auVar53,auVar49);
              *(int *)(puVar17 + 1) = auVar52._0_4_;
              auVar52 = valignd_avx512vl(auVar53,auVar53,1);
              auVar70 = ZEXT3264(auVar52);
              puVar17 = puVar17 + 2;
            }
            goto LAB_01d8f7d9;
          }
          auVar57 = vpermi2q_avx512vl(auVar56,auVar50,auVar51);
          uVar18 = auVar57._0_8_;
          auVar57 = vmovdqa64_avx512vl(auVar50);
          auVar57 = vpermt2q_avx512vl(auVar57,auVar53,auVar51);
          *puVar17 = auVar57._0_8_;
          auVar53 = vpermd_avx512vl(auVar53,auVar49);
          *(int *)(puVar17 + 1) = auVar53._0_4_;
          auVar53 = vmovdqa64_avx512vl(auVar50);
          auVar53 = vpermt2q_avx512vl(auVar53,auVar55,auVar51);
          puVar17[2] = auVar53._0_8_;
          auVar53 = vpermd_avx512vl(auVar55,auVar49);
          *(int *)(puVar17 + 3) = auVar53._0_4_;
          auVar50 = vpermt2q_avx512vl(auVar50,auVar52,auVar51);
          puVar17[4] = auVar50._0_8_;
          lVar29 = 0x28;
          lVar26 = 0x30;
        }
      }
      auVar49 = vpermd_avx512vl(auVar52,auVar49);
      *(int *)((long)puVar17 + lVar29) = auVar49._0_4_;
      puVar17 = (ulong *)((long)puVar17 + lVar26);
    }
  } while( true );
  uVar19 = uVar18 & 0xfffffffffffffff0;
  for (lVar26 = 0; lVar26 != (ulong)((uint)uVar18 & 0xf) - 8; lVar26 = lVar26 + 1) {
    lVar29 = lVar26 * 0xb0;
    auVar43 = *(undefined1 (*) [16])(uVar19 + 0x80 + lVar29);
    auVar45 = *(undefined1 (*) [16])(uVar19 + 0x40 + lVar29);
    auVar44 = *(undefined1 (*) [16])(uVar19 + 0x70 + lVar29);
    auVar47 = *(undefined1 (*) [16])(uVar19 + 0x50 + lVar29);
    auVar34 = vmulps_avx512vl(auVar45,auVar43);
    auVar46 = *(undefined1 (*) [16])(uVar19 + 0x60 + lVar29);
    auVar7 = *(undefined1 (*) [16])(uVar19 + 0x30 + lVar29);
    local_23a8 = vfmsub231ps_avx512vl(auVar34,auVar44,auVar47);
    auVar34 = vmulps_avx512vl(auVar47,auVar46);
    local_2398 = vfmsub231ps_avx512vl(auVar34,auVar43,auVar7);
    auVar35 = vmulps_avx512vl(auVar7,auVar44);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar42._4_4_ = uVar5;
    auVar42._0_4_ = uVar5;
    auVar42._8_4_ = uVar5;
    auVar42._12_4_ = uVar5;
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar41._4_4_ = uVar5;
    auVar41._0_4_ = uVar5;
    auVar41._8_4_ = uVar5;
    auVar41._12_4_ = uVar5;
    uVar5 = *(undefined4 *)(ray + k * 4);
    auVar34._4_4_ = uVar5;
    auVar34._0_4_ = uVar5;
    auVar34._8_4_ = uVar5;
    auVar34._12_4_ = uVar5;
    auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + lVar29),auVar34);
    local_2388 = vfmsub231ps_avx512vl(auVar35,auVar46,auVar45);
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar35._4_4_ = uVar5;
    auVar35._0_4_ = uVar5;
    auVar35._8_4_ = uVar5;
    auVar35._12_4_ = uVar5;
    auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x10 + lVar29),auVar35);
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
    auVar37._4_4_ = uVar5;
    auVar37._0_4_ = uVar5;
    auVar37._8_4_ = uVar5;
    auVar37._12_4_ = uVar5;
    auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x20 + lVar29),auVar37);
    auVar38 = vmulps_avx512vl(auVar42,auVar37);
    auVar38 = vfmsub231ps_avx512vl(auVar38,auVar35,auVar41);
    auVar39 = vmulps_avx512vl(auVar41,auVar34);
    auVar39 = vfmsub231ps_avx512vl(auVar39,auVar37,auVar36);
    auVar40 = vmulps_avx512vl(auVar36,auVar35);
    auVar40 = vfmsub231ps_avx512vl(auVar40,auVar34,auVar42);
    auVar41 = vmulps_avx512vl(local_2388,auVar41);
    auVar41 = vfmadd231ps_avx512vl(auVar41,local_2398,auVar42);
    auVar36 = vfmadd231ps_avx512vl(auVar41,local_23a8,auVar36);
    auVar41 = vandps_avx512vl(auVar36,auVar68);
    auVar42 = vandps_avx512vl(auVar36,auVar67);
    auVar43 = vmulps_avx512vl(auVar43,auVar40);
    auVar43 = vfmadd231ps_avx512vl(auVar43,auVar39,auVar44);
    auVar43 = vfmadd231ps_avx512vl(auVar43,auVar38,auVar46);
    auVar43 = vxorps_avx512vl(auVar42,auVar43);
    auVar44 = vmulps_avx512vl(auVar47,auVar40);
    auVar45 = vfmadd231ps_avx512vl(auVar44,auVar45,auVar39);
    auVar45 = vfmadd231ps_avx512vl(auVar45,auVar7,auVar38);
    auVar45 = vxorps_avx512vl(auVar42,auVar45);
    uVar16 = vcmpps_avx512vl(auVar43,auVar32,5);
    uVar13 = vcmpps_avx512vl(auVar45,auVar32,5);
    uVar14 = vcmpps_avx512vl(auVar36,auVar32,4);
    auVar44 = vaddps_avx512vl(auVar43,auVar45);
    uVar15 = vcmpps_avx512vl(auVar44,auVar41,2);
    bVar25 = (byte)uVar16 & (byte)uVar13 & (byte)uVar14 & (byte)uVar15;
    if (bVar25 != 0) {
      auVar44 = vmulps_avx512vl(local_2388,auVar37);
      auVar44 = vfmadd213ps_avx512vl(auVar35,local_2398,auVar44);
      auVar44 = vfmadd213ps_avx512vl(auVar34,local_23a8,auVar44);
      auVar46 = vxorps_avx512vl(auVar42,auVar44);
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar44._4_4_ = uVar5;
      auVar44._0_4_ = uVar5;
      auVar44._8_4_ = uVar5;
      auVar44._12_4_ = uVar5;
      auVar44 = vmulps_avx512vl(auVar41,auVar44);
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar47._4_4_ = uVar5;
      auVar47._0_4_ = uVar5;
      auVar47._8_4_ = uVar5;
      auVar47._12_4_ = uVar5;
      auVar47 = vmulps_avx512vl(auVar41,auVar47);
      uVar16 = vcmpps_avx512vl(auVar46,auVar47,2);
      uVar13 = vcmpps_avx512vl(auVar44,auVar46,1);
      bVar25 = (byte)uVar16 & (byte)uVar13 & bVar25;
      if (bVar25 != 0) {
        auVar44 = vrcp14ps_avx512vl(auVar41);
        auVar7._8_4_ = 0x3f800000;
        auVar7._0_8_ = 0x3f8000003f800000;
        auVar7._12_4_ = 0x3f800000;
        auVar47 = vfnmadd213ps_avx512vl(auVar41,auVar44,auVar7);
        auVar44 = vfmadd132ps_avx512vl(auVar47,auVar44,auVar44);
        local_23b8 = vmulps_avx512vl(auVar44,auVar46);
        local_23d8 = vmulps_avx512vl(auVar44,auVar43);
        local_23c8 = vmulps_avx512vl(auVar44,auVar45);
        auVar43 = vblendmps_avx512vl(auVar33,local_23b8);
        auVar46._0_4_ =
             (uint)(bVar25 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar25 & 1) * local_23c8._0_4_;
        bVar30 = (bool)(bVar25 >> 1 & 1);
        auVar46._4_4_ = (uint)bVar30 * auVar43._4_4_ | (uint)!bVar30 * local_23c8._4_4_;
        bVar30 = (bool)(bVar25 >> 2 & 1);
        auVar46._8_4_ = (uint)bVar30 * auVar43._8_4_ | (uint)!bVar30 * local_23c8._8_4_;
        bVar30 = (bool)(bVar25 >> 3 & 1);
        auVar46._12_4_ = (uint)bVar30 * auVar43._12_4_ | (uint)!bVar30 * local_23c8._12_4_;
        auVar43 = vshufps_avx(auVar46,auVar46,0xb1);
        auVar43 = vminps_avx(auVar43,auVar46);
        auVar45 = vshufpd_avx(auVar43,auVar43,1);
        auVar43 = vminps_avx(auVar45,auVar43);
        uVar16 = vcmpps_avx512vl(auVar46,auVar43,0);
        bVar31 = bVar25;
        if (((byte)uVar16 & bVar25) != 0) {
          bVar31 = (byte)uVar16 & bVar25;
        }
        uVar27 = 0;
        for (uVar24 = (uint)bVar31; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
          uVar27 = uVar27 + 1;
        }
        while( true ) {
          uVar24 = *(uint *)(lVar29 + uVar19 + 0x90 + (ulong)(uVar27 & 0xff) * 4);
          if ((((context->scene->geometries).items[uVar24].ptr)->mask &
              *(uint *)(ray + k * 4 + 0x90)) != 0) break;
          bVar31 = (byte)(1 << (uVar27 & 0x1f));
          if ((~bVar31 & bVar25) == 0) goto LAB_01d8fd05;
          bVar25 = ~bVar31 & bVar25;
          auVar43 = vblendmps_avx512vl(auVar33,local_23b8);
          auVar36._0_4_ =
               (uint)(bVar25 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar25 & 1) * auVar46._0_4_;
          bVar30 = (bool)(bVar25 >> 1 & 1);
          auVar36._4_4_ = (uint)bVar30 * auVar43._4_4_ | (uint)!bVar30 * auVar46._4_4_;
          bVar30 = (bool)(bVar25 >> 2 & 1);
          auVar36._8_4_ = (uint)bVar30 * auVar43._8_4_ | (uint)!bVar30 * auVar46._8_4_;
          bVar30 = (bool)(bVar25 >> 3 & 1);
          auVar36._12_4_ = (uint)bVar30 * auVar43._12_4_ | (uint)!bVar30 * auVar46._12_4_;
          auVar43 = vshufps_avx(auVar36,auVar36,0xb1);
          auVar43 = vminps_avx(auVar43,auVar36);
          auVar45 = vshufpd_avx(auVar43,auVar43,1);
          auVar43 = vminps_avx(auVar45,auVar43);
          uVar16 = vcmpps_avx512vl(auVar36,auVar43,0);
          bVar23 = (byte)uVar16 & bVar25;
          bVar31 = bVar25;
          if (bVar23 != 0) {
            bVar31 = bVar23;
          }
          uVar27 = 0;
          for (uVar24 = (uint)bVar31; auVar46 = auVar36, (uVar24 & 1) == 0;
              uVar24 = uVar24 >> 1 | 0x80000000) {
            uVar27 = uVar27 + 1;
          }
        }
        uVar28 = (ulong)((uVar27 & 0xff) << 2);
        uVar5 = *(undefined4 *)(local_23d8 + uVar28);
        uVar6 = *(undefined4 *)(local_23c8 + uVar28);
        *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_23b8 + uVar28);
        *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_23a8 + uVar28);
        *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2398 + uVar28);
        *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2388 + uVar28);
        *(undefined4 *)(ray + k * 4 + 0xf0) = uVar5;
        *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
        *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar29 + uVar19 + 0xa0 + uVar28);
        *(uint *)(ray + k * 4 + 0x120) = uVar24;
        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
      }
    }
LAB_01d8fd05:
  }
  auVar49 = vpbroadcastd_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar69 = ZEXT3264(auVar49);
  goto LAB_01d8f7b8;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }